

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

int kftp_connect(knetFile *ftp)

{
  int iVar1;
  knetFile *ftp_local;
  
  iVar1 = socket_connect(ftp->host,ftp->port);
  ftp->ctrl_fd = iVar1;
  if (ftp->ctrl_fd == -1) {
    ftp_local._4_4_ = -1;
  }
  else {
    kftp_get_response(ftp);
    kftp_send_cmd(ftp,"USER anonymous\r\n",1);
    kftp_send_cmd(ftp,"PASS kftp@\r\n",1);
    kftp_send_cmd(ftp,"TYPE I\r\n",1);
    ftp_local._4_4_ = 0;
  }
  return ftp_local._4_4_;
}

Assistant:

int kftp_connect(knetFile *ftp)
{
	ftp->ctrl_fd = socket_connect(ftp->host, ftp->port);
	if (ftp->ctrl_fd == -1) return -1;
	kftp_get_response(ftp);
	kftp_send_cmd(ftp, "USER anonymous\r\n", 1);
	kftp_send_cmd(ftp, "PASS kftp@\r\n", 1);
	kftp_send_cmd(ftp, "TYPE I\r\n", 1);
	return 0;
}